

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_if.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  time_t tVar2;
  time_t tVar3;
  tm *__tp;
  char *pcVar4;
  time_t time;
  string ANS;
  
  ANS._M_dataplus._M_p = (pointer)&ANS.field_2;
  ANS._M_string_length = 0;
  ANS.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&ANS);
  poVar1 = std::operator<<((ostream *)&std::cout,'\n');
  poVar1 = std::operator<<(poVar1,(string *)&ANS);
  std::endl<char,std::char_traits<char>>(poVar1);
  tVar2 = ::time((time_t *)0x0);
  time = tVar2;
  tVar3 = ::time((time_t *)0x0);
  if (tVar3 == tVar2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Runtime-Evaluated:\t");
    __tp = localtime(&time);
    pcVar4 = asctime(__tp);
    std::operator<<(poVar1,pcVar4);
  }
  if (argc == 4) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Your CMD/Terminal Args (4) are: \"");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1,"\", \"");
    poVar1 = std::operator<<(poVar1,argv[1]);
    poVar1 = std::operator<<(poVar1,"\", \"");
    poVar1 = std::operator<<(poVar1,argv[2]);
    poVar1 = std::operator<<(poVar1,"\", and \"");
    poVar1 = std::operator<<(poVar1,argv[3]);
    poVar1 = std::operator<<(poVar1,"\".\n");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&ANS);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	/*	An example of an if condition that can be 
		evaluated at compile-time. This will succeed
		with constexpr if as well as a regular if. */
	std::string ANS;
	if constexpr (9-9>2) ANS = "Compile-Time Evaluation with \'if constexpr\'.";
	else ANS = "Compile-Time Evaluation with \'if constexpr\'.";
	std::cout << '\n' << ANS << std::endl;

	/*	Two example of runtime evaluated conditions.
		These will fail with constexpr if but will
		succeed with regular if. */

	//The time is only known at runtime
	std::time_t time = std::time(NULL);
	//if constexpr (std::time (NULL) == time) {
	if (std::time (NULL) == time ) {
		std::cout << "Runtime-Evaluated:\t" <<
		std::asctime(std::localtime(&time));
	}
	//Args are only known at runtime
	//if constexpr (argc == 4) {
	if (argc == 4) {
		std::cout << "Your CMD/Terminal Args (4) are: \""
		<< argv[0] << "\", \"" << argv[1] << "\", \"" << argv[2]
		<< "\", and \"" << argv[3] << "\".\n" << std::endl;
	}
	std::cout << std::endl;
}